

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.c
# Opt level: O2

void RangeEnc_EncodeDirectBits(CRangeEnc *p,UInt32 value,uint numBits)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  
  uVar4 = numBits - 1;
  do {
    uVar1 = p->range;
    uVar2 = uVar1 >> 1;
    p->range = uVar2;
    uVar3 = (ulong)uVar2;
    if ((value >> (uVar4 & 0x1f) & 1) == 0) {
      uVar3 = 0;
    }
    p->low = p->low + uVar3;
    if (uVar1 < 0x2000000) {
      p->range = uVar2 << 8;
      RangeEnc_ShiftLow(p);
    }
    bVar5 = uVar4 != 0;
    uVar4 = uVar4 - 1;
  } while (bVar5);
  return;
}

Assistant:

static void RangeEnc_EncodeDirectBits(CRangeEnc *p, UInt32 value, unsigned numBits)
{
  do
  {
    p->range >>= 1;
    p->low += p->range & (0 - ((value >> --numBits) & 1));
    if (p->range < kTopValue)
    {
      p->range <<= 8;
      RangeEnc_ShiftLow(p);
    }
  }
  while (numBits != 0);
}